

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

char * booster::locale::details::string_cast_traits<char>::cast(char *msg,string *buffer)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  
  pcVar3 = msg;
  do {
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while ((byte)(cVar1 - 1U) < 0x7e);
  if (cVar1 != '\0') {
    strlen(msg);
    std::__cxx11::string::reserve((ulong)buffer);
    bVar2 = *msg;
    if (bVar2 != 0) {
      pbVar4 = (byte *)(msg + 1);
      do {
        if (bVar2 < 0x7f) {
          std::__cxx11::string::push_back((char)buffer);
        }
        bVar2 = *pbVar4;
        pbVar4 = pbVar4 + 1;
      } while (bVar2 != 0);
    }
    msg = (buffer->_M_dataplus)._M_p;
  }
  return msg;
}

Assistant:

static char const *cast(char const *msg,std::string &buffer)
                {
                    if(is_us_ascii_string(msg))
                        return msg;
                    buffer.reserve(strlen(msg));
                    char c;
                    while((c=*msg++)!=0) {
                        if(is_us_ascii_char(c))
                            buffer+=c;
                    }
                    return buffer.c_str();
                }